

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::CumSumLayerParams::SerializeWithCachedSizes
          (CumSumLayerParams *this,CodedOutputStream *output)

{
  bool bVar1;
  int64 iVar2;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  CumSumLayerParams *this_local;
  
  iVar2 = axis(this);
  if (iVar2 != 0) {
    iVar2 = axis(this);
    google::protobuf::internal::WireFormatLite::WriteInt64(1,iVar2,output);
  }
  bVar1 = excludefinalsum(this);
  if (bVar1) {
    bVar1 = excludefinalsum(this);
    google::protobuf::internal::WireFormatLite::WriteBool(2,bVar1,output);
  }
  bVar1 = reverse(this);
  if (bVar1) {
    bVar1 = reverse(this);
    google::protobuf::internal::WireFormatLite::WriteBool(3,bVar1,output);
  }
  return;
}

Assistant:

void CumSumLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.CumSumLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // int64 axis = 1;
  if (this->axis() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64(1, this->axis(), output);
  }

  // bool excludeFinalSum = 2;
  if (this->excludefinalsum() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(2, this->excludefinalsum(), output);
  }

  // bool reverse = 3;
  if (this->reverse() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(3, this->reverse(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.CumSumLayerParams)
}